

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::dht_get_peers(session_impl *this,sha1_hash *info_hash)

{
  dht_tracker *this_00;
  function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  local_60;
  _Bind<void_(*(std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>))(libtorrent::aux::alert_manager_&,_libtorrent::digest32<160L>,_const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  local_40;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_false>.
    _M_head_impl._M_data = (reference_wrapper<libtorrent::aux::alert_manager>)&this->m_alerts;
    local_40._M_f = anon_unknown_119::on_dht_get_peers;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems._0_8_ =
         *(undefined8 *)(info_hash->m_number)._M_elems;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems._8_8_ =
         *(undefined8 *)((info_hash->m_number)._M_elems + 2);
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems[4] =
         (info_hash->m_number)._M_elems[4];
    ::std::
    function<void(std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>const&)>
    ::
    function<std::_Bind<void(*(std::reference_wrapper<libtorrent::aux::alert_manager>,libtorrent::digest32<160l>,std::_Placeholder<1>))(libtorrent::aux::alert_manager&,libtorrent::digest32<160l>,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>const&)>,void>
              ((function<void(std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>const&)>
                *)&local_60,&local_40);
    libtorrent::dht::dht_tracker::get_peers(this_00,info_hash,&local_60);
    ::std::_Function_base::~_Function_base(&local_60.super__Function_base);
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}